

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

int google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
              (UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  LogMessage *other;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  LogFinisher local_75;
  int local_74;
  UnknownFieldSet *local_70;
  LogMessage local_68;
  
  local_74 = 4;
  lVar9 = 0;
  lVar8 = 0;
  iVar6 = 0;
  local_70 = unknown_fields;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)(int)((ulong)((long)(pvVar1->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar5 <= lVar8) break;
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((*(uint *)(&pUVar2->field_0x0 + lVar9) & 0xe0000000) == 0x60000000) {
      uVar7 = *(uint *)(&pUVar2->field_0x0 + lVar9) & 0x1fffffff;
      iVar3 = 1;
      if (0x7f < uVar7) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
      }
      if ((*(uint *)(&pUVar2->field_0x0 + lVar9) & 0xe0000000) != 0x60000000) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/unknown_field_set.h"
                   ,0x130);
        other = LogMessage::operator<<
                          (&local_68,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type_): ");
        LogFinisher::operator=(&local_75,other);
        LogMessage::~LogMessage(&local_68);
      }
      unknown_fields = local_70;
      uVar7 = *(uint *)(*(long *)((long)&pUVar2->field_2 + lVar9) + 8);
      iVar4 = 1;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
      }
      iVar6 = iVar6 + local_74 + iVar3 + uVar7 + iVar4;
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  return iVar6;
}

Assistant:

int WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  int size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}